

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

long duckdb::DatePart::PartOperator<duckdb::DatePart::CenturyOperator>::
     Operation<duckdb::timestamp_t,long>
               (timestamp_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  timestamp_t in_RDI;
  idx_t in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  bVar1 = Value::IsFinite<duckdb::timestamp_t>(in_RDI);
  if (bVar1) {
    local_8 = CenturyOperator::Operation<duckdb::timestamp_t,long>(in_RDI);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)in_RDI.value,in_stack_ffffffffffffffc8);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}